

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O3

void __thiscall embree::SubdivMesh::SubdivMesh(SubdivMesh *this,Device *device)

{
  size_t *psVar1;
  bool *pbVar2;
  undefined8 *puVar3;
  size_t sVar4;
  Topology *pTVar5;
  Device *pDVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Buffer *pBVar11;
  HoleSet *pHVar12;
  VertexCreaseMap *pVVar13;
  EdgeCreaseMap *pEVar14;
  BufferView<embree::Vec3fa> *pBVar15;
  undefined8 *puVar16;
  long lVar17;
  Topology *pTVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  pointer *__ptr;
  size_type sVar22;
  size_t i;
  MemoryMonitorInterface *pMVar23;
  ulong uVar24;
  Topology local_d0;
  
  Geometry::Geometry(&this->super_Geometry,device,GTY_SUBDIV_MESH,0,1);
  (this->super_Geometry).super_RefCount._vptr_RefCount = (_func_int **)&PTR__SubdivMesh_02191418;
  *(undefined8 *)&(this->super_Geometry).field_0x58 = 0;
  (this->faceVertices).super_RawBufferView.ptr_ofs = (char *)0x0;
  (this->faceVertices).super_RawBufferView.dptr_ofs = (char *)0x0;
  (this->faceVertices).super_RawBufferView.stride = 0;
  *(undefined8 *)((long)&(this->faceVertices).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->faceVertices).super_RawBufferView.num + 4) = 0;
  (this->faceVertices).super_RawBufferView.modCounter = 1;
  (this->faceVertices).super_RawBufferView.modified = true;
  (this->faceVertices).super_RawBufferView.userData = 0;
  (this->faceVertices).super_RawBufferView.buffer.ptr = (Buffer *)0x0;
  psVar1 = &(this->topology).size_active;
  (this->topology).size_active = 0;
  (this->topology).size_alloced = 0;
  (this->topology).items = (Topology *)0x0;
  (this->vertices).size_active = 0;
  (this->vertices).size_alloced = 0;
  (this->vertices).items = (BufferView<embree::Vec3fa> *)0x0;
  (this->vertexAttribs).size_active = 0;
  (this->vertexAttribs).size_alloced = 0;
  (this->vertexAttribs).items = (RawBufferView *)0x0;
  (this->edge_creases).super_RawBufferView.ptr_ofs = (char *)0x0;
  (this->edge_creases).super_RawBufferView.dptr_ofs = (char *)0x0;
  (this->edge_creases).super_RawBufferView.stride = 0;
  *(undefined8 *)((long)&(this->edge_creases).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->edge_creases).super_RawBufferView.num + 4) = 0;
  (this->edge_creases).super_RawBufferView.modCounter = 1;
  (this->edge_creases).super_RawBufferView.modified = true;
  *(undefined8 *)((long)&(this->edge_crease_weights).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->edge_crease_weights).super_RawBufferView.num + 4) = 0;
  *(undefined8 *)((long)&(this->edge_crease_weights).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->edge_crease_weights).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)&(this->edge_creases).super_RawBufferView.userData = 0;
  *(undefined8 *)((long)&(this->edge_creases).super_RawBufferView.buffer.ptr + 4) = 0;
  (this->edge_crease_weights).super_RawBufferView.modCounter = 1;
  (this->edge_crease_weights).super_RawBufferView.modified = true;
  *(undefined8 *)&(this->edge_crease_weights).super_RawBufferView.userData = 0;
  *(undefined8 *)((long)&(this->edge_crease_weights).super_RawBufferView.buffer.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_creases).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_creases).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_creases).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_creases).super_RawBufferView.num + 4) = 0;
  (this->vertex_creases).super_RawBufferView.modCounter = 1;
  (this->vertex_creases).super_RawBufferView.modified = true;
  *(undefined8 *)&(this->vertex_creases).super_RawBufferView.userData = 0;
  *(undefined8 *)((long)&(this->vertex_creases).super_RawBufferView.buffer.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_crease_weights).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_crease_weights).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_crease_weights).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_crease_weights).super_RawBufferView.num + 4) = 0;
  (this->vertex_crease_weights).super_RawBufferView.modCounter = 1;
  (this->vertex_crease_weights).super_RawBufferView.modified = true;
  *(undefined8 *)((long)&(this->levels).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->levels).super_RawBufferView.num + 4) = 0;
  *(undefined8 *)((long)&(this->levels).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->levels).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)&(this->vertex_crease_weights).super_RawBufferView.userData = 0;
  *(undefined8 *)((long)&(this->vertex_crease_weights).super_RawBufferView.buffer.ptr + 4) = 0;
  (this->levels).super_RawBufferView.modCounter = 1;
  (this->levels).super_RawBufferView.modified = true;
  (this->levels).super_RawBufferView.userData = 0;
  (this->levels).super_RawBufferView.buffer.ptr = (Buffer *)0x0;
  this->tessellationRate = 2.0;
  (this->holes).super_RawBufferView.ptr_ofs = (char *)0x0;
  (this->holes).super_RawBufferView.dptr_ofs = (char *)0x0;
  (this->holes).super_RawBufferView.stride = 0;
  (this->holes).super_RawBufferView.num = 0;
  (this->holes).super_RawBufferView.format = RTC_FORMAT_UNDEFINED;
  (this->holes).super_RawBufferView.modCounter = 1;
  (this->holes).super_RawBufferView.modified = true;
  pMVar23 = &device->super_MemoryMonitorInterface;
  if (device == (Device *)0x0) {
    pMVar23 = (MemoryMonitorInterface *)0x0;
  }
  *(undefined8 *)&(this->holes).super_RawBufferView.userData = 0;
  *(undefined8 *)((long)&(this->holes).super_RawBufferView.buffer.ptr + 4) = 0;
  *(undefined4 *)((long)&this->numHalfEdges + 4) = 0;
  (this->faceStartEdge).alloc.device = pMVar23;
  (this->faceStartEdge).alloc.hugepages = false;
  (this->faceStartEdge).size_active = 0;
  (this->faceStartEdge).size_alloced = 0;
  (this->faceStartEdge).items = (uint *)0x0;
  (this->halfEdgeFace).alloc.device = pMVar23;
  (this->halfEdgeFace).alloc.hugepages = false;
  (this->halfEdgeFace).items = (uint *)0x0;
  (this->halfEdgeFace).size_active = 0;
  (this->halfEdgeFace).size_alloced = 0;
  pHVar12 = (HoleSet *)operator_new(0x18);
  *(undefined8 *)&(pHVar12->holeSet).vec = 0;
  (pHVar12->holeSet).vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pHVar12->holeSet).vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->holeSet)._M_t.super___uniq_ptr_impl<embree::HoleSet,_std::default_delete<embree::HoleSet>_>
  ._M_t.super__Tuple_impl<0UL,_embree::HoleSet_*,_std::default_delete<embree::HoleSet>_>.
  super__Head_base<0UL,_embree::HoleSet_*,_false>._M_head_impl = pHVar12;
  (this->invalid_face).alloc.device = pMVar23;
  (this->invalid_face).alloc.hugepages = false;
  (this->invalid_face).size_active = 0;
  (this->invalid_face).size_alloced = 0;
  (this->invalid_face).items = (char *)0x0;
  (this->vertex_buffer_tags).
  super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_buffer_tags).
  super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertex_buffer_tags).
  super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vertex_attrib_buffer_tags).
  super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_attrib_buffer_tags).
  super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertex_attrib_buffer_tags).
  super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->patch_eval_trees).
  super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->patch_eval_trees).
  super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->patch_eval_trees).
  super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar13 = (VertexCreaseMap *)operator_new(0x18);
  *(undefined8 *)&(pVVar13->vertexCreaseMap).vec = 0;
  (pVVar13->vertexCreaseMap).vec.
  super__Vector_base<embree::parallel_map<unsigned_int,_float>::KeyValue,_std::allocator<embree::parallel_map<unsigned_int,_float>::KeyValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pVVar13->vertexCreaseMap).vec.
  super__Vector_base<embree::parallel_map<unsigned_int,_float>::KeyValue,_std::allocator<embree::parallel_map<unsigned_int,_float>::KeyValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vertexCreaseMap)._M_t.
  super___uniq_ptr_impl<embree::VertexCreaseMap,_std::default_delete<embree::VertexCreaseMap>_>._M_t
  .super__Tuple_impl<0UL,_embree::VertexCreaseMap_*,_std::default_delete<embree::VertexCreaseMap>_>.
  super__Head_base<0UL,_embree::VertexCreaseMap_*,_false>._M_head_impl = pVVar13;
  pEVar14 = (EdgeCreaseMap *)operator_new(0x18);
  *(undefined8 *)&(pEVar14->edgeCreaseMap).vec = 0;
  (pEVar14->edgeCreaseMap).vec.
  super__Vector_base<embree::parallel_map<unsigned_long,_float>::KeyValue,_std::allocator<embree::parallel_map<unsigned_long,_float>::KeyValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pEVar14->edgeCreaseMap).vec.
  super__Vector_base<embree::parallel_map<unsigned_long,_float>::KeyValue,_std::allocator<embree::parallel_map<unsigned_long,_float>::KeyValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->edgeCreaseMap)._M_t.
  super___uniq_ptr_impl<embree::EdgeCreaseMap,_std::default_delete<embree::EdgeCreaseMap>_>._M_t.
  super__Tuple_impl<0UL,_embree::EdgeCreaseMap_*,_std::default_delete<embree::EdgeCreaseMap>_>.
  super__Head_base<0UL,_embree::EdgeCreaseMap_*,_false>._M_head_impl = pEVar14;
  this->commitCounter = 0;
  uVar24 = (ulong)(this->super_Geometry).numTimeSteps;
  if (uVar24 == 0) {
    (this->vertices).size_active = 0;
    sVar22 = 0;
  }
  else {
    pBVar15 = __gnu_cxx::new_allocator<embree::BufferView<embree::Vec3fa>_>::allocate
                        ((new_allocator<embree::BufferView<embree::Vec3fa>_> *)&this->vertices,
                         uVar24,(void *)0x0);
    (this->vertices).items = pBVar15;
    if ((this->vertices).size_active == 0) {
      uVar21 = 0;
    }
    else {
      puVar16 = (undefined8 *)&DAT_00000030;
      uVar19 = 0;
      do {
        pBVar15 = (this->vertices).items;
        uVar7 = puVar16[-6];
        uVar8 = puVar16[-5];
        uVar9 = puVar16[-4];
        uVar10 = puVar16[-3];
        pBVar11 = (Buffer *)puVar16[-1];
        pbVar2 = &pBVar15[-1].super_RawBufferView.modified + (long)puVar16;
        *(undefined8 *)pbVar2 = puVar16[-2];
        ((Ref<embree::Buffer> *)(pbVar2 + 8))->ptr = pBVar11;
        puVar3 = (undefined8 *)((long)&pBVar15[-1].super_RawBufferView.num + (long)puVar16);
        *puVar3 = uVar9;
        puVar3[1] = uVar10;
        puVar3 = (undefined8 *)((long)&pBVar15[-1].super_RawBufferView.dptr_ofs + (long)puVar16);
        *puVar3 = uVar7;
        puVar3[1] = uVar8;
        *(undefined8 *)((long)&(pBVar15->super_RawBufferView).ptr_ofs + (long)puVar16) = *puVar16;
        *puVar16 = 0;
        uVar19 = uVar19 + 1;
        uVar21 = (this->vertices).size_active;
        puVar16 = puVar16 + 7;
      } while (uVar19 < uVar21);
    }
    lVar17 = uVar24 - uVar21;
    if (uVar21 <= uVar24 && lVar17 != 0) {
      lVar20 = uVar21 * 0x38 + 0x30;
      do {
        pBVar15 = (this->vertices).items;
        puVar16 = (undefined8 *)((long)pBVar15 + lVar20 + -0x20);
        *puVar16 = 0;
        puVar16[1] = 0;
        puVar16 = (undefined8 *)((long)pBVar15 + lVar20 + -0x30);
        *puVar16 = 0;
        puVar16[1] = 0;
        *(undefined8 *)((long)pBVar15 + lVar20 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar15 + lVar20 + -8) = 1;
        *(undefined4 *)((long)pBVar15 + lVar20 + -4) = 0;
        *(undefined8 *)((long)&(pBVar15->super_RawBufferView).ptr_ofs + lVar20) = 0;
        lVar20 = lVar20 + 0x38;
        lVar17 = lVar17 + -1;
      } while (lVar17 != 0);
    }
    operator_delete((void *)0x0);
    (this->vertices).size_active = uVar24;
    (this->vertices).size_alloced = uVar24;
    sVar22 = (size_type)(this->super_Geometry).numTimeSteps;
  }
  std::
  vector<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ::resize(&this->vertex_buffer_tags,sVar22);
  uVar24 = (this->topology).size_active;
  sVar4 = (this->topology).size_alloced;
  sVar22 = sVar4 + (sVar4 == 0);
  if (uVar24 < 2) {
    if (sVar4 != 0) {
      if (uVar24 == 0) {
        pTVar5 = (this->topology).items;
        (pTVar5->vertexIndices).super_RawBufferView.stride = 0;
        (pTVar5->vertexIndices).super_RawBufferView.num = 0;
        (pTVar5->vertexIndices).super_RawBufferView.ptr_ofs = (char *)0x0;
        (pTVar5->vertexIndices).super_RawBufferView.dptr_ofs = (char *)0x0;
        (pTVar5->vertexIndices).super_RawBufferView.format = RTC_FORMAT_UNDEFINED;
        (pTVar5->vertexIndices).super_RawBufferView.modCounter = 1;
        (pTVar5->vertexIndices).super_RawBufferView.modified = true;
        (pTVar5->vertexIndices).super_RawBufferView.userData = 0;
        (pTVar5->vertexIndices).super_RawBufferView.buffer.ptr = (Buffer *)0x0;
        (pTVar5->halfEdges).alloc.device = (MemoryMonitorInterface *)0x0;
        (pTVar5->halfEdges).alloc.hugepages = false;
        (pTVar5->halfEdges).size_active = 0;
        (pTVar5->halfEdges).size_alloced = 0;
        (pTVar5->halfEdges).items = (HalfEdge *)0x0;
        (pTVar5->halfEdges0).
        super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pTVar5->halfEdges0).
        super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pTVar5->halfEdges0).
        super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pTVar5->halfEdges1).
        super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pTVar5->halfEdges1).
        super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pTVar5->halfEdges1).
        super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      goto LAB_00d2be04;
    }
  }
  else {
    uVar24 = 1;
    lVar17 = 0xa0;
    do {
      Topology::~Topology((Topology *)((long)&((this->topology).items)->mesh + lVar17));
      uVar24 = uVar24 + 1;
      lVar17 = lVar17 + 0xa0;
    } while (uVar24 < (this->topology).size_active);
    (this->topology).size_active = 1;
    if ((this->topology).size_alloced == sVar22) {
LAB_00d2be04:
      *psVar1 = 1;
      goto LAB_00d2bef5;
    }
  }
  pTVar5 = (this->topology).items;
  pTVar18 = __gnu_cxx::new_allocator<embree::SubdivMesh::Topology>::allocate
                      ((new_allocator<embree::SubdivMesh::Topology> *)&this->topology,sVar22,
                       (void *)0x0);
  (this->topology).items = pTVar18;
  if ((this->topology).size_active == 0) {
LAB_00d2be92:
    pTVar18 = (this->topology).items;
    (pTVar18->vertexIndices).super_RawBufferView.stride = 0;
    (pTVar18->vertexIndices).super_RawBufferView.num = 0;
    (pTVar18->vertexIndices).super_RawBufferView.ptr_ofs = (char *)0x0;
    (pTVar18->vertexIndices).super_RawBufferView.dptr_ofs = (char *)0x0;
    (pTVar18->vertexIndices).super_RawBufferView.format = RTC_FORMAT_UNDEFINED;
    (pTVar18->vertexIndices).super_RawBufferView.modCounter = 1;
    (pTVar18->vertexIndices).super_RawBufferView.modified = true;
    (pTVar18->vertexIndices).super_RawBufferView.userData = 0;
    (pTVar18->vertexIndices).super_RawBufferView.buffer.ptr = (Buffer *)0x0;
    (pTVar18->halfEdges).alloc.device = (MemoryMonitorInterface *)0x0;
    (pTVar18->halfEdges).alloc.hugepages = false;
    (pTVar18->halfEdges).size_active = 0;
    (pTVar18->halfEdges).size_alloced = 0;
    (pTVar18->halfEdges).items = (HalfEdge *)0x0;
    (pTVar18->halfEdges0).
    super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar18->halfEdges0).
    super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar18->halfEdges0).
    super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pTVar18->halfEdges1).
    super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar18->halfEdges1).
    super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar18->halfEdges1).
    super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    lVar17 = 0;
    uVar24 = 0;
    do {
      pTVar18 = (Topology *)((long)&pTVar5->mesh + lVar17);
      Topology::Topology((Topology *)((long)&((this->topology).items)->mesh + lVar17),pTVar18);
      Topology::~Topology(pTVar18);
      uVar24 = uVar24 + 1;
      uVar21 = *psVar1;
      lVar17 = lVar17 + 0xa0;
    } while (uVar24 < uVar21);
    if (uVar21 == 0) goto LAB_00d2be92;
  }
  operator_delete(pTVar5);
  (this->topology).size_active = 1;
  (this->topology).size_alloced = sVar22;
LAB_00d2bef5:
  local_d0.vertexIndices.super_RawBufferView.ptr_ofs = (char *)0x0;
  local_d0.vertexIndices.super_RawBufferView.dptr_ofs = (char *)0x0;
  local_d0.vertexIndices.super_RawBufferView.stride = 0;
  local_d0.vertexIndices.super_RawBufferView.num = 0;
  local_d0.vertexIndices.super_RawBufferView.format = RTC_FORMAT_UNDEFINED;
  local_d0.vertexIndices.super_RawBufferView.modCounter = 1;
  local_d0.vertexIndices.super_RawBufferView.modified = true;
  local_d0.vertexIndices.super_RawBufferView.userData = 0;
  local_d0.vertexIndices.super_RawBufferView.buffer.ptr = (Buffer *)0x0;
  local_d0.subdiv_mode = RTC_SUBDIVISION_MODE_SMOOTH_BOUNDARY;
  pDVar6 = (this->super_Geometry).device;
  local_d0.halfEdges.alloc.device = &pDVar6->super_MemoryMonitorInterface;
  if (pDVar6 == (Device *)0x0) {
    local_d0.halfEdges.alloc.device = (MemoryMonitorInterface *)0x0;
  }
  local_d0.halfEdges.alloc.hugepages = false;
  local_d0.halfEdges.size_active = 0;
  local_d0.halfEdges.size_alloced = 0;
  local_d0.halfEdges.items = (HalfEdge *)0x0;
  local_d0.halfEdges0.
  super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.halfEdges0.
  super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.halfEdges0.
  super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.halfEdges1.
  super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.halfEdges1.
  super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.halfEdges1.
  super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.mesh = this;
  Topology::operator=((this->topology).items,&local_d0);
  if (local_d0.halfEdges1.
      super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.halfEdges1.
                    super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.halfEdges0.
      super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.halfEdges0.
                    super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  sVar4 = local_d0.halfEdges.size_alloced;
  if (local_d0.halfEdges.items != (HalfEdge *)0x0) {
    if (local_d0.halfEdges.size_alloced << 5 < 0x1c00000) {
      alignedFree(local_d0.halfEdges.items);
    }
    else {
      os_free(local_d0.halfEdges.items,local_d0.halfEdges.size_alloced << 5,
              local_d0.halfEdges.alloc.hugepages);
    }
  }
  if (sVar4 != 0) {
    (**(local_d0.halfEdges.alloc.device)->_vptr_MemoryMonitorInterface)
              (local_d0.halfEdges.alloc.device,sVar4 * -0x20,1);
  }
  local_d0.halfEdges.size_active = 0;
  local_d0.halfEdges.size_alloced = 0;
  local_d0.halfEdges.items = (HalfEdge *)0x0;
  if (local_d0.vertexIndices.super_RawBufferView.buffer.ptr != (Buffer *)0x0) {
    (*((local_d0.vertexIndices.super_RawBufferView.buffer.ptr)->super_RefCount)._vptr_RefCount[3])()
    ;
  }
  return;
}

Assistant:

SubdivMesh::SubdivMesh (Device* device)
    : Geometry(device,GTY_SUBDIV_MESH,0,1), 
      displFunc(nullptr),
      tessellationRate(2.0f),
      numHalfEdges(0),
      faceStartEdge(device,0),
      halfEdgeFace(device,0),
      holeSet(new HoleSet),
      invalid_face(device,0),
      vertexCreaseMap(new VertexCreaseMap),
      edgeCreaseMap(new EdgeCreaseMap),
      commitCounter(0)
  {
    
    vertices.resize(numTimeSteps);
    vertex_buffer_tags.resize(numTimeSteps);
    topology.resize(1);
    topology[0] = Topology(this);
  }